

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O2

bool __thiscall
QRegularExpressionMatch::hasCaptured(QRegularExpressionMatch *this,QAnyStringView name)

{
  bool bVar1;
  int nth;
  
  nth = QRegularExpressionPrivate::captureIndexForName
                  ((((this->d).d.ptr)->regularExpression).d.d.ptr,name);
  bVar1 = hasCaptured(this,nth);
  return bVar1;
}

Assistant:

bool QRegularExpressionMatch::hasCaptured(QAnyStringView name) const
{
    const int nth = d->regularExpression.d->captureIndexForName(name);
    return hasCaptured(nth);
}